

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall WriterTest_WriteChar_Test::TestBody(WriterTest_WriteChar_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  AssertionResult *pAVar5;
  undefined8 uVar6;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  AssertionResult gtest_ar;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a20;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a00;
  char *local_9e0;
  AssertionResult local_9d8;
  AssertionResult local_9c8;
  wchar_t local_9b8;
  undefined4 uStack_9b4;
  undefined1 local_9a8 [16];
  AssertionResult local_998 [7];
  ios_base local_928 [128];
  long alStack_8a8 [17];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_820;
  undefined4 *local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined4 local_800 [500];
  
  local_9e0 = "char";
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
  local_808 = 500;
  local_810 = 1;
  local_800[0] = CONCAT31(local_800[0]._1_3_,0x61);
  local_818 = local_800;
  if (local_800 == (undefined4 *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_a20.field_2._M_local_buf[0]._0_2_ = 0x61;
  local_a20._M_string_length = 1;
  paVar1 = &local_a00.field_2;
  local_a00._M_string_length = 0;
  local_a00.field_2._M_local_buf[0] = local_a00.field_2._M_local_buf[0] & 0xffffff00;
  local_a00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
  local_9b8 = CONCAT31(local_9b8._1_3_,0x61);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,(char *)&local_9b8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a00,(string *)&local_9b8);
  if ((undefined1 *)CONCAT44(uStack_9b4,local_9b8) != local_9a8) {
    operator_delete((undefined1 *)CONCAT44(uStack_9b4,local_9b8));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
  std::ios_base::~ios_base(local_928);
  if (local_a00._M_string_length == local_a20._M_string_length) {
    if (local_a00._M_string_length != 0) {
      iVar4 = bcmp(local_a00._M_dataplus._M_p,local_a20._M_dataplus._M_p,local_a00._M_string_length)
      ;
      if (iVar4 != 0) goto LAB_00123e85;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_00123e85:
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_9e0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [21])">() << value).str()\n");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x24a059);
    pAVar5 = testing::AssertionResult::operator<<
                       (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a20);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x24a728);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x24a065);
    pAVar5 = testing::AssertionResult::operator<<
                       (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a00);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x24a728);
    testing::AssertionResult::AssertionResult(&local_9c8,pAVar5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_998[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a00._M_dataplus._M_p != paVar1) {
    operator_delete(local_a00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p);
  }
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
  if (local_9c8.success_ != true) {
    testing::AssertionResult::AssertionResult(&local_9d8,&local_9c8);
    goto LAB_001241db;
  }
  local_9e0 = "wchar_t";
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
  local_808 = 500;
  local_810 = 1;
  local_800[0] = 0x61;
  local_818 = local_800;
  if (local_800 == (undefined4 *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_a20.field_2._M_allocated_capacity = 0x61;
  local_a20._M_string_length = 1;
  local_a00._M_string_length = 0;
  local_a00.field_2._M_local_buf[0] = L'\0';
  local_a00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_998);
  plVar2 = *(long **)((long)alStack_8a8 + *(long *)(local_998[0]._0_8_ + -0x18));
  if (plVar2 == (long *)0x0) {
    uVar6 = std::__throw_bad_cast();
    __clang_call_terminate(uVar6);
  }
  local_9b8 = (**(code **)(*plVar2 + 0x50))(plVar2,0x61);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)local_998,&local_9b8,1);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstring::operator=((wstring *)&local_a00,(wstring *)&local_9b8);
  if ((undefined1 *)CONCAT44(uStack_9b4,local_9b8) != local_9a8) {
    operator_delete((undefined1 *)CONCAT44(uStack_9b4,local_9b8));
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_998);
  std::ios_base::~ios_base(local_928);
  if (local_a00._M_string_length == local_a20._M_string_length) {
    if (local_a00._M_string_length != 0) {
      iVar4 = wmemcmp(local_a00._M_dataplus._M_p,local_a20._M_dataplus._M_p,
                      local_a00._M_string_length);
      if (iVar4 != 0) goto LAB_001240d2;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_001240d2:
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_9e0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [21])">() << value).str()\n");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x24a059);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_a20);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x24a728);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])0x24a065);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_a00);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])0x24a728);
    testing::AssertionResult::AssertionResult(&local_9d8,pAVar5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_998[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a00._M_dataplus._M_p != paVar1) {
    operator_delete(local_a00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p);
  }
  local_820.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
LAB_001241db:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9c8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_9d8.success_ == false) {
    testing::Message::Message((Message *)&local_820);
    if (local_9d8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_9d8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x2aa,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_998,(Message *)&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_998);
    if (local_820.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_820.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_820.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(WriterTest, WriteChar) {
  CHECK_WRITE('a');
}